

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O2

bool __thiscall irr::scene::CSkinnedMesh::useAnimationFrom(CSkinnedMesh *this,ISkinnedMesh *mesh)

{
  pointer ppSVar1;
  SJoint *__lhs;
  SJoint *__rhs;
  byte bVar2;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[1]> _Var3;
  __optional_eq_t<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_> _Var4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  u32 j;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  
  uVar8 = 0;
  bVar7 = 0;
  while( true ) {
    ppSVar1 = (this->AllJoints).m_data.
              super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(this->AllJoints).m_data.
                       super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1) >> 3 & 0xffffffff
        ) <= uVar8) break;
    __lhs = ppSVar1[uVar8];
    __lhs->UseAnimationFrom = (SJoint *)0x0;
    _Var3 = ::std::operator==(&__lhs->Name,(char (*) [1])"");
    bVar2 = 1;
    if (!_Var3) {
      uVar6 = 0;
      while( true ) {
        iVar5 = (*(mesh->super_IAnimatedMesh).super_IMesh._vptr_IMesh[0x1c])(mesh);
        if (((ulong)(((long *)CONCAT44(extraout_var,iVar5))[1] -
                    *(long *)CONCAT44(extraout_var,iVar5)) >> 3 & 0xffffffff) <= uVar6) break;
        iVar5 = (*(mesh->super_IAnimatedMesh).super_IMesh._vptr_IMesh[0x1c])(mesh);
        __rhs = *(SJoint **)(*(long *)CONCAT44(extraout_var_00,iVar5) + uVar6 * 8);
        _Var4 = ::std::operator==(&__lhs->Name,&__rhs->Name);
        if (_Var4) {
          __lhs->UseAnimationFrom = __rhs;
        }
        uVar6 = uVar6 + 1;
      }
      bVar2 = __lhs->UseAnimationFrom == (SJoint *)0x0 | bVar7;
    }
    bVar7 = bVar2;
    uVar8 = uVar8 + 1;
  }
  checkForAnimation(this);
  return (bool)(~bVar7 & 1);
}

Assistant:

bool CSkinnedMesh::useAnimationFrom(const ISkinnedMesh *mesh)
{
	bool unmatched = false;

	for (u32 i = 0; i < AllJoints.size(); ++i) {
		SJoint *joint = AllJoints[i];
		joint->UseAnimationFrom = 0;

		if (joint->Name == "")
			unmatched = true;
		else {
			for (u32 j = 0; j < mesh->getAllJoints().size(); ++j) {
				SJoint *otherJoint = mesh->getAllJoints()[j];
				if (joint->Name == otherJoint->Name) {
					joint->UseAnimationFrom = otherJoint;
				}
			}
			if (!joint->UseAnimationFrom)
				unmatched = true;
		}
	}

	checkForAnimation();

	return !unmatched;
}